

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O2

uint __thiscall IntrusiveList<ExprBase>::size(IntrusiveList<ExprBase> *this)

{
  uint count;
  
  count = 0;
  while( true ) {
    if (this->head == (ExprBase *)0x0) break;
    count = count + 1;
    this = (IntrusiveList<ExprBase> *)&this->head->next;
  }
  return count;
}

Assistant:

unsigned size() const
	{
		unsigned count = 0;

		T *curr = head;

		while(curr)
		{
			count++;

			curr = static_cast<T*>(curr->next);
		}

		return count;
	}